

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTree::childAt(QAccessibleTree *this,int x,int y)

{
  Representation RVar1;
  int iVar2;
  int iVar3;
  QWidget *parent;
  QAbstractItemModel *pQVar4;
  QWidget *this_00;
  QPoint QVar5;
  QTreeView *pQVar6;
  QHeaderView *pQVar7;
  QAccessibleInterface *pQVar8;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = (QWidget *)QAccessibleTable::view(&this->super_QAccessibleTable);
  if (parent != (QWidget *)0x0) {
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)parent);
    if (pQVar4 != (QAbstractItemModel *)0x0) {
      this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)parent);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      QVar5 = QWidget::mapTo(this_00,parent,(QPoint *)&local_58);
      local_58._0_4_ = x - QVar5.xp.m_i;
      local_58._4_4_ = y - QVar5.yp.m_i;
      local_40 = QWidget::mapFromGlobal(parent,(QPoint *)&local_58);
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      (**(code **)(*(long *)parent + 0x1f0))(&local_58,parent);
      pQVar8 = (QAccessibleInterface *)0x0;
      if (((-1 < local_58._0_4_) && (-1 < (long)local_58)) &&
         (local_48.ptr != (QAbstractItemModel *)0x0)) {
        pQVar6 = QtPrivate::qobject_cast_helper<QTreeView_const*,QObject_const>((QObject *)parent);
        iVar2 = QTreeViewPrivate::viewIndex
                          (*(QTreeViewPrivate **)
                            &(pQVar6->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget.field_0x8,(QModelIndex *)&local_58);
        pQVar7 = QAccessibleTable::horizontalHeader(&this->super_QAccessibleTable);
        RVar1.m_i = local_58._4_4_;
        QAbstractItemView::rootIndex(&local_70,(QAbstractItemView *)parent);
        iVar3 = (**(code **)(*(long *)pQVar4 + 0x80))(pQVar4,&local_70);
        pQVar8 = (QAccessibleInterface *)
                 (**(code **)(*(long *)&this->super_QAccessibleTable + 0x100))
                           (this,((iVar2 + 1) - (uint)(pQVar7 == (QHeaderView *)0x0)) * iVar3 +
                                 RVar1.m_i);
      }
      goto LAB_004dbf7a;
    }
  }
  pQVar8 = (QAccessibleInterface *)0x0;
LAB_004dbf7a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTree::childAt(int x, int y) const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    const QPoint viewportOffset = theView->viewport()->mapTo(theView, QPoint(0, 0));
    const QPoint indexPosition = theView->mapFromGlobal(QPoint(x, y) - viewportOffset);

    const QModelIndex index = theView->indexAt(indexPosition);
    if (!index.isValid())
        return nullptr;

    const QTreeView *treeView = qobject_cast<const QTreeView *>(theView);
    int row = treeView->d_func()->viewIndex(index) + (horizontalHeader() ? 1 : 0);
    int column = index.column();

    int i = row * theModel->columnCount(theView->rootIndex()) + column;
    return child(i);
}